

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 VmRegisterSpecialFunction(jx9_vm *pVm)

{
  int iVar1;
  uint local_20;
  sxu32 n;
  sxi32 rc;
  jx9_vm *pVm_local;
  
  local_20 = 0;
  while( true ) {
    if (0x1d < local_20) {
      return 0;
    }
    iVar1 = jx9_create_function(pVm,aVmFunc[local_20].zName,aVmFunc[local_20].xFunc,pVm);
    if (iVar1 != 0) break;
    local_20 = local_20 + 1;
  }
  return iVar1;
}

Assistant:

static sxi32 VmRegisterSpecialFunction(jx9_vm *pVm)
{
	sxi32 rc;
	sxu32 n;
	for( n = 0 ; n < SX_ARRAYSIZE(aVmFunc) ; ++n ){
		/* Note that these special functions have access
		 * to the underlying virtual machine as their
		 * private data.
		 */
		rc = jx9_create_function(&(*pVm), aVmFunc[n].zName, aVmFunc[n].xFunc, &(*pVm));
		if( rc != SXRET_OK ){
			return rc;
		}
	}
	return SXRET_OK;
}